

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocumentlayout.cpp
# Opt level: O0

void __thiscall
QTextDocumentLayoutPrivate::drawFrame
          (QTextDocumentLayoutPrivate *this,QPointF *offset,QPainter *painter,PaintContext *context,
          QTextFrame *frame)

{
  const_iterator __first;
  QRectF cellRect_00;
  QRectF cellRect_01;
  Iterator it_00;
  value_type_conflict4 vVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  QTextFrameData *pQVar5;
  QDebug *o;
  QTextDocumentLayoutPrivate *this_00;
  long lVar6;
  qsizetype qVar7;
  QTextDocumentLayoutPrivate *pQVar8;
  reference pvVar9;
  QTextTableData *td_00;
  QTextFrameData *pQVar10;
  int *piVar11;
  const_reference pQVar12;
  const_iterator cVar13;
  QTextFrame *pQVar14;
  long in_RCX;
  __off_t __length;
  __off_t __length_00;
  PaintContext *in_RSI;
  char *pcVar15;
  QPainter *in_RDI;
  QTextFrame *in_R8;
  long in_FS_OFFSET;
  qreal qVar16;
  qreal dx;
  int cursorPos;
  int i_1;
  int numFloats;
  int c_2;
  int r_1;
  int c_1;
  int lastRow;
  int c;
  int r;
  qreal headerOffset;
  int page;
  int headerRowCount;
  int tableEndPage;
  int tableStartPage;
  QTextFrame *parentFrame;
  Selection *s;
  int i;
  QTextTableData *td;
  int columns;
  int rows;
  QTextTable *table;
  QTextFrameData *fd;
  QPen oldPen;
  QList<QTextFrame_*> floats;
  QRectF cellRect_1;
  const_iterator rowIt;
  int firstRow;
  QRectF cellRect;
  QFixed pageTop;
  QFixed absYPos;
  QFixed pageHeight;
  int num_cols;
  int num_rows;
  int col_start;
  int row_start;
  QRectF frameRect;
  QPointF offsetOfRepaintedCursorBlock;
  QPointF off;
  Iterator it;
  PaintContext cell_context_1;
  QTextTableCell cell_2;
  QTextTableCell cell_1;
  PaintContext cell_context;
  QTextTableCell cell;
  QTextBlock cursorBlockNeedingRepaint;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category;
  QVarLengthArray<int,_256LL> selectedTableCells;
  PaintContext *in_stack_fffffffffffff6b8;
  QVarLengthArray<int,_256LL> *in_stack_fffffffffffff6c0;
  QTextDocumentPrivate *in_stack_fffffffffffff6c8;
  QRectF *in_stack_fffffffffffff6d0;
  QFixedSize *in_stack_fffffffffffff6d8;
  QTextCursor *in_stack_fffffffffffff6e0;
  undefined4 in_stack_fffffffffffff6e8;
  undefined4 in_stack_fffffffffffff6ec;
  const_iterator in_stack_fffffffffffff6f0;
  undefined4 in_stack_fffffffffffff6f8;
  int iVar17;
  undefined4 in_stack_fffffffffffff6fc;
  int iVar18;
  QTextTable *in_stack_fffffffffffff700;
  QTextDocumentLayoutPrivate *in_stack_fffffffffffff708;
  undefined4 in_stack_fffffffffffff710;
  int in_stack_fffffffffffff714;
  int in_stack_fffffffffffff718;
  int iVar19;
  undefined4 in_stack_fffffffffffff728;
  value_type_conflict4 vVar20;
  QFixed in_stack_fffffffffffff72c;
  QRectF *in_stack_fffffffffffff748;
  QRectF *in_stack_fffffffffffff750;
  QTextFrameData *in_stack_fffffffffffff758;
  QTextFrame *in_stack_fffffffffffff760;
  QTextBlock *in_stack_fffffffffffff768;
  QTextDocumentLayoutPrivate *in_stack_fffffffffffff770;
  undefined4 in_stack_fffffffffffff788;
  undefined4 in_stack_fffffffffffff78c;
  int local_864;
  undefined4 in_stack_fffffffffffff7a0;
  int iVar21;
  undefined4 in_stack_fffffffffffff7a4;
  int iVar22;
  undefined4 in_stack_fffffffffffff7a8;
  int in_stack_fffffffffffff7ac;
  const_iterator in_stack_fffffffffffff7b0;
  const_iterator in_stack_fffffffffffff7b8;
  const_iterator in_stack_fffffffffffff7c0;
  int local_810;
  int local_808;
  int local_804;
  int local_7f8;
  const_reference in_stack_fffffffffffff820;
  undefined4 in_stack_fffffffffffff828;
  int iVar23;
  undefined8 in_stack_fffffffffffff8b0;
  undefined8 in_stack_fffffffffffff8b8;
  PaintContext *pPVar24;
  undefined8 in_stack_fffffffffffff8c0;
  QVarLengthArray<int,_256LL> *pQVar25;
  undefined8 in_stack_fffffffffffff8c8;
  int local_728;
  QFixed in_stack_fffffffffffff8dc;
  const_iterator local_710;
  int local_704;
  PaintContext *local_700;
  QVarLengthArray<int,_256LL> *local_6f8;
  QTextDocumentPrivate *local_6f0;
  QRectF *local_6e8;
  QRectF local_6e0;
  int local_6bc;
  QFixed local_6b8;
  int local_6b4;
  undefined4 local_6b0;
  int local_6ac;
  uint local_6a8;
  int local_6a4;
  int local_6a0;
  int local_69c;
  int local_698;
  int local_694;
  int local_690;
  uint local_68c;
  int local_688;
  int local_684;
  QFixed local_680;
  uint local_67c;
  QFixed local_678;
  int local_674;
  QFixed local_670;
  QFixed local_66c;
  QFixed local_668;
  QFixed local_664;
  QSizeF local_660;
  uint local_64c;
  value_type_conflict4 local_648;
  value_type_conflict4 local_644;
  value_type_conflict4 local_640;
  value_type_conflict4 local_63c;
  QSizeF local_638;
  undefined8 local_628;
  undefined8 local_620;
  undefined8 local_618;
  undefined8 local_610;
  QRectF local_608;
  QDebug local_5d8;
  QDebug local_5d0;
  QDebug local_5c8;
  QPointF local_5c0;
  QPointF local_5b0;
  QPoint local_5a0;
  QPointF local_598;
  PaintContext *local_588;
  QVarLengthArray<int,_256LL> *local_580;
  QTextDocumentPrivate *local_578;
  undefined1 *local_570;
  PaintContext *local_568;
  QVarLengthArray<int,_256LL> *local_560;
  QTextDocumentPrivate *local_558;
  undefined4 local_550;
  PaintContext *local_548;
  QVarLengthArray<int,_256LL> *local_540;
  QTextDocumentPrivate *local_538;
  undefined1 *local_530;
  undefined1 local_528 [24];
  int in_stack_fffffffffffffaf0;
  int in_stack_fffffffffffffaf8;
  QTextBlock *in_stack_fffffffffffffb00;
  QPointF *in_stack_fffffffffffffb08;
  undefined1 local_4d8 [16];
  undefined1 local_4c8 [16];
  undefined1 local_4b8 [80];
  undefined1 local_468 [32];
  undefined1 local_448 [16];
  undefined1 *local_438;
  undefined1 *local_430;
  QVLABase<int> local_428 [43];
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar5 = ::data((QTextFrame *)in_stack_fffffffffffff6c0);
  if ((pQVar5->layoutDirty & 1U) != 0) goto LAB_007fbabe;
  local_598.xp = -NAN;
  local_598.yp = -NAN;
  local_5c0 = QFixedPoint::toPointF((QFixedPoint *)in_stack_fffffffffffff6d8);
  local_5b0 = ::operator+((QPointF *)in_stack_fffffffffffff6c8,(QPointF *)in_stack_fffffffffffff6c0)
  ;
  local_5a0 = QPointF::toPoint((QPointF *)in_stack_fffffffffffff6d0);
  QPointF::QPointF((QPointF *)in_stack_fffffffffffff6c0,(QPoint *)in_stack_fffffffffffff6b8);
  bVar2 = QRectF::isValid((QRectF *)(in_RCX + 0x18));
  if (bVar2) {
    in_stack_fffffffffffff770 = (QTextDocumentLayoutPrivate *)QPointF::y(&local_598);
    qVar16 = QRectF::bottom((QRectF *)(in_RCX + 0x18));
    if (qVar16 < (double)in_stack_fffffffffffff770) goto LAB_007fbabe;
    in_stack_fffffffffffff760 = (QTextFrame *)QPointF::y(&local_598);
    qVar16 = QFixed::toReal(&(pQVar5->size).height);
    in_stack_fffffffffffff768 = (QTextBlock *)((double)in_stack_fffffffffffff760 + qVar16);
    qVar16 = QRectF::top((QRectF *)(in_RCX + 0x18));
    if ((double)in_stack_fffffffffffff768 < qVar16) goto LAB_007fbabe;
    in_stack_fffffffffffff758 = (QTextFrameData *)QPointF::x(&local_598);
    qVar16 = QRectF::right((QRectF *)(in_RCX + 0x18));
    if (qVar16 < (double)in_stack_fffffffffffff758) goto LAB_007fbabe;
    in_stack_fffffffffffff748 = (QRectF *)QPointF::x(&local_598);
    qVar16 = QFixed::toReal(&(pQVar5->size).width);
    in_stack_fffffffffffff750 = (QRectF *)((double)in_stack_fffffffffffff748 + qVar16);
    qVar16 = QRectF::left((QRectF *)(in_RCX + 0x18));
    if ((double)in_stack_fffffffffffff750 < qVar16) goto LAB_007fbabe;
  }
  local_438 = &DAT_aaaaaaaaaaaaaaaa;
  local_430 = &DAT_aaaaaaaaaaaaaaaa;
  lcDraw();
  anon_unknown.dwarf_13b8fb2::QLoggingCategoryMacroHolder<(QtMsgType)0>::QLoggingCategoryMacroHolder
            ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)in_stack_fffffffffffff6c0,
             (QLoggingCategory *)in_stack_fffffffffffff6b8);
  while (bVar2 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                           ((QLoggingCategoryMacroHolder *)&local_438), bVar2) {
    anon_unknown.dwarf_13b8fb2::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
              ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x7fa602);
    QMessageLogger::QMessageLogger
              ((QMessageLogger *)in_stack_fffffffffffff6d0,(char *)in_stack_fffffffffffff6c8,
               (int)((ulong)in_stack_fffffffffffff6c0 >> 0x20),(char *)in_stack_fffffffffffff6b8,
               (char *)0x7fa61b);
    QMessageLogger::debug();
    QDebug::operator<<((QDebug *)in_stack_fffffffffffff6d8,(char *)in_stack_fffffffffffff708);
    QTextFrame::firstPosition((QTextFrame *)in_stack_fffffffffffff6b8);
    QDebug::operator<<((QDebug *)in_stack_fffffffffffff6c0,
                       (int)((ulong)in_stack_fffffffffffff6b8 >> 0x20));
    QDebug::operator<<((QDebug *)in_stack_fffffffffffff6d8,(char *)in_stack_fffffffffffff708);
    QTextFrame::lastPosition((QTextFrame *)in_stack_fffffffffffff6b8);
    QDebug::operator<<((QDebug *)in_stack_fffffffffffff6c0,
                       (int)((ulong)in_stack_fffffffffffff6b8 >> 0x20));
    o = QDebug::operator<<((QDebug *)in_stack_fffffffffffff6d8,(char *)in_stack_fffffffffffff708);
    QDebug::QDebug(&local_5d0,o);
    ::operator<<((Stream *)&local_5c8,(QPointF *)&local_5d0);
    QDebug::~QDebug(&local_5c8);
    QDebug::~QDebug(&local_5d0);
    QDebug::~QDebug(&local_5d8);
    local_430 = (undefined1 *)((ulong)local_430 & 0xffffffffffffff00);
  }
  local_448._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_448._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QTextBlock::QTextBlock((QTextBlock *)local_448);
  local_608.xp = local_598.xp;
  local_608.yp = local_598.yp;
  this_00 = (QTextDocumentLayoutPrivate *)qobject_cast<QTextTable*>((QObject *)0x7fa781);
  local_628 = 0xffffffffffffffff;
  local_620 = 0xffffffffffffffff;
  local_618 = 0xffffffffffffffff;
  local_610 = 0xffffffffffffffff;
  local_638 = QFixedSize::toSizeF(in_stack_fffffffffffff6d8);
  QRectF::QRectF(in_stack_fffffffffffff6d0,(QPointF *)in_stack_fffffffffffff6c8,
                 (QSizeF *)in_stack_fffffffffffff6c0);
  if (this_00 == (QTextDocumentLayoutPrivate *)0x0) {
    drawFrameDecoration(in_stack_fffffffffffff770,(QPainter *)in_stack_fffffffffffff768,
                        in_stack_fffffffffffff760,in_stack_fffffffffffff758,
                        in_stack_fffffffffffff750,in_stack_fffffffffffff748);
    local_548 = (PaintContext *)&DAT_aaaaaaaaaaaaaaaa;
    local_540 = (QVarLengthArray<int,_256LL> *)&DAT_aaaaaaaaaaaaaaaa;
    local_538 = (QTextDocumentPrivate *)&DAT_aaaaaaaaaaaaaaaa;
    local_530 = &DAT_aaaaaaaaaaaaaaaa;
    QTextFrame::begin((QTextFrame *)in_stack_fffffffffffff6f0.i);
    pQVar14 = QTextDocumentPrivate::rootFrame(in_stack_fffffffffffff6c8);
    if (in_R8 == pQVar14) {
      QRectF::top((QRectF *)(in_RCX + 0x18));
      QFixed::fromReal((qreal)in_stack_fffffffffffff6b8);
      frameIteratorForYPosition(in_stack_fffffffffffff708,in_stack_fffffffffffff72c);
      local_548 = local_568;
      local_540 = local_560;
      local_538 = local_558;
      local_530 = (undefined1 *)CONCAT44(local_530._4_4_,local_550);
    }
    QList<QTextFrame_*>::QList((QList<QTextFrame_*> *)0x7fb88b);
    qVar7 = QList<QPointer<QTextFrame>_>::size(&pQVar5->floats);
    iVar3 = (int)qVar7;
    QList<QTextFrame_*>::reserve
              ((QList<QTextFrame_*> *)CONCAT44(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8),
               CONCAT44(in_stack_fffffffffffff72c.val,in_stack_fffffffffffff728));
    for (iVar23 = 0; iVar23 < iVar3; iVar23 = iVar23 + 1) {
      QList<QPointer<QTextFrame>_>::at
                ((QList<QPointer<QTextFrame>_> *)in_stack_fffffffffffff6c0,
                 (qsizetype)in_stack_fffffffffffff6b8);
      ::QPointer::operator_cast_to_QTextFrame_((QPointer<QTextFrame> *)0x7fb8f4);
      QList<QTextFrame_*>::append
                ((QList<QTextFrame_*> *)0x7fb904,(parameter_type)in_stack_fffffffffffff6b8);
    }
    local_588 = local_548;
    local_580 = local_540;
    local_578 = local_538;
    local_570 = local_530;
    it_00.b = (int)in_stack_fffffffffffff8b8;
    it_00.e = (int)((ulong)in_stack_fffffffffffff8b8 >> 0x20);
    it_00.f = (QTextFrame *)in_stack_fffffffffffff8b0;
    it_00.cf = (QTextFrame *)in_stack_fffffffffffff8c0;
    it_00._24_8_ = in_stack_fffffffffffff8c8;
    in_stack_fffffffffffff6b8 = local_548;
    in_stack_fffffffffffff6c0 = local_540;
    in_stack_fffffffffffff6c8 = local_538;
    drawFlow((QTextDocumentLayoutPrivate *)CONCAT44(iVar3,iVar23),
             (QPointF *)CONCAT44(in_stack_fffffffffffff78c,in_stack_fffffffffffff788),in_RDI,in_RSI,
             it_00,(QList<QTextFrame_*> *)in_stack_fffffffffffff770,in_stack_fffffffffffff768);
    QList<QTextFrame_*>::~QList((QList<QTextFrame_*> *)0x7fb9c3);
  }
  else {
    local_810 = QTextTable::rows((QTextTable *)in_stack_fffffffffffff6c0);
    iVar3 = QTextTable::columns((QTextTable *)in_stack_fffffffffffff6c0);
    pQVar5 = ::data((QTextFrame *)in_stack_fffffffffffff6c0);
    memset(local_428,0xaa,0x418);
    QList<QAbstractTextDocumentLayout::Selection>::size
              ((QList<QAbstractTextDocumentLayout::Selection> *)(in_RCX + 0x38));
    QVarLengthArray<int,_256LL>::QVarLengthArray
              (in_stack_fffffffffffff6c0,(qsizetype)in_stack_fffffffffffff6b8);
    for (iVar23 = 0; lVar6 = (long)iVar23,
        qVar7 = QList<QAbstractTextDocumentLayout::Selection>::size
                          ((QList<QAbstractTextDocumentLayout::Selection> *)(in_RCX + 0x38)),
        lVar6 < qVar7; iVar23 = iVar23 + 1) {
      in_stack_fffffffffffff820 =
           QList<QAbstractTextDocumentLayout::Selection>::at
                     ((QList<QAbstractTextDocumentLayout::Selection> *)in_stack_fffffffffffff6c0,
                      (qsizetype)in_stack_fffffffffffff6b8);
      local_63c = -1;
      local_640 = -1;
      local_644 = -1;
      local_648 = -1;
      pQVar8 = (QTextDocumentLayoutPrivate *)
               QTextCursor::currentTable((QTextCursor *)in_stack_fffffffffffff6d8);
      if (pQVar8 == this_00) {
        QTextCursor::selectedTableCells
                  (in_stack_fffffffffffff6e0,(int *)in_stack_fffffffffffff6d8,
                   (int *)in_stack_fffffffffffff6d0,(int *)in_stack_fffffffffffff6c8,
                   (int *)in_stack_fffffffffffff6c0);
      }
      vVar1 = local_63c;
      pvVar9 = QVLABase<int>::operator[]((QVLABase<int> *)in_stack_fffffffffffff6b8,0x7fa98f);
      vVar20 = local_640;
      *pvVar9 = vVar1;
      pvVar9 = QVLABase<int>::operator[]((QVLABase<int> *)in_stack_fffffffffffff6b8,0x7fa9bd);
      *pvVar9 = vVar20;
      vVar20 = local_644;
      pvVar9 = QVLABase<int>::operator[]((QVLABase<int> *)in_stack_fffffffffffff6b8,0x7fa9eb);
      *pvVar9 = vVar20;
      vVar20 = local_648;
      pvVar9 = QVLABase<int>::operator[]((QVLABase<int> *)in_stack_fffffffffffff6b8,0x7faa19);
      *pvVar9 = vVar20;
    }
    local_64c = 0xaaaaaaaa;
    local_660 = QTextDocument::pageSize((QTextDocument *)in_stack_fffffffffffff6c8);
    QSizeF::height(&local_660);
    local_664 = QFixed::fromReal((qreal)in_stack_fffffffffffff6b8);
    local_64c = (uint)local_664;
    QFixed::QFixed(&local_668,0);
    bVar2 = operator<=(local_664,local_668);
    if (bVar2) {
      QFixed::QFixed(&local_66c,0x7fffff);
      local_64c = local_66c.val;
    }
    local_670.val = (pQVar5->position).y.val;
    td_00 = (QTextTableData *)QTextFrame::parentFrame((QTextFrame *)in_stack_fffffffffffff6c0);
    while (td_00 != (QTextTableData *)0x0) {
      pQVar10 = ::data((QTextFrame *)in_stack_fffffffffffff6c0);
      local_674 = (pQVar10->position).y.val;
      QFixed::operator+=(&local_670,(QFixed)local_674);
      td_00 = (QTextTableData *)QTextFrame::parentFrame((QTextFrame *)in_stack_fffffffffffff6c0);
    }
    local_67c = local_64c;
    pcVar15 = (char *)(ulong)local_64c;
    local_678 = QFixed::operator/((QFixed *)in_stack_fffffffffffff6b8,(int)in_stack_fffffffffffff6c8
                                 );
    local_7f8 = QFixed::truncate(&local_678,pcVar15,__length);
    local_688 = (pQVar5->size).height.val;
    local_684 = (int)QFixed::operator+((QFixed *)in_stack_fffffffffffff6b8,
                                       (QFixed)(int)in_stack_fffffffffffff6c0);
    local_68c = local_64c;
    pcVar15 = (char *)(ulong)local_64c;
    local_680 = QFixed::operator/((QFixed *)in_stack_fffffffffffff6b8,(int)in_stack_fffffffffffff6c8
                                 );
    iVar4 = QFixed::truncate(&local_680,pcVar15,__length_00);
    if ((pQVar5[2].sizeDirty & 1U) == 0) {
      drawFrameDecoration(in_stack_fffffffffffff770,(QPainter *)in_stack_fffffffffffff768,
                          in_stack_fffffffffffff760,in_stack_fffffffffffff758,
                          in_stack_fffffffffffff750,in_stack_fffffffffffff748);
    }
    QTextTable::format((QTextTable *)in_stack_fffffffffffff6d0);
    local_690 = QTextTableFormat::headerRowCount((QTextTableFormat *)0x7fac6b);
    local_694 = local_810 + -1;
    piVar11 = qMin<int>(&local_690,&local_694);
    iVar22 = *piVar11;
    QTextTableFormat::~QTextTableFormat((QTextTableFormat *)0x7facab);
    iVar19 = iVar22;
    while (local_7f8 = local_7f8 + 1, local_7f8 <= iVar4) {
      local_698 = 0xaaaaaaaa;
      local_6a8 = local_64c;
      local_6a4 = (int)::operator*(0,(QFixed)(int)((ulong)in_stack_fffffffffffff6b8 >> 0x20));
      local_6ac = (pQVar5->effectiveTopMargin).val;
      local_6a0 = (int)QFixed::operator+((QFixed *)in_stack_fffffffffffff6b8,
                                         (QFixed)(int)in_stack_fffffffffffff6c0);
      local_6b0 = *(undefined4 *)&pQVar5[1].super_QTextFrameLayoutData._vptr_QTextFrameLayoutData;
      local_69c = (int)QFixed::operator+((QFixed *)in_stack_fffffffffffff6b8,
                                         (QFixed)(int)in_stack_fffffffffffff6c0);
      local_6b4 = (pQVar5->border).val;
      local_698 = (int)QFixed::operator+((QFixed *)in_stack_fffffffffffff6b8,
                                         (QFixed)(int)in_stack_fffffffffffff6c0);
      pQVar12 = QList<QFixed>::at((QList<QFixed> *)in_stack_fffffffffffff6c0,
                                  (qsizetype)in_stack_fffffffffffff6b8);
      local_6bc = pQVar12->val;
      local_6b8 = QFixed::operator-((QFixed *)in_stack_fffffffffffff6b8,
                                    (int)in_stack_fffffffffffff6c0);
      qVar16 = QFixed::toReal(&local_6b8);
      for (local_804 = 0; local_804 < iVar22; local_804 = local_804 + 1) {
        for (local_808 = 0; local_808 < iVar3; local_808 = local_808 + 1) {
          local_468._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
          local_468._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
          QTextTable::cellAt((QTextTable *)in_stack_fffffffffffff6d8,
                             (int)((ulong)in_stack_fffffffffffff6d0 >> 0x20),
                             (int)in_stack_fffffffffffff6d0);
          memcpy(local_4b8,&DAT_00bd2020,0x50);
          QAbstractTextDocumentLayout::PaintContext::PaintContext
                    ((PaintContext *)in_stack_fffffffffffff6c0,in_stack_fffffffffffff6b8);
          in_stack_fffffffffffff714 = local_804;
          in_stack_fffffffffffff718 = local_808;
          QVLABase<int>::data(local_428);
          adjustContextSelectionsForCell
                    ((PaintContext *)in_stack_fffffffffffff6f0.i,
                     (QTextTableCell *)CONCAT44(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8)
                     ,(int)((ulong)in_stack_fffffffffffff6e0 >> 0x20),(int)in_stack_fffffffffffff6e0
                     ,(int *)in_stack_fffffffffffff6d8);
          local_6e0.xp = -NAN;
          local_6e0.yp = -NAN;
          local_6e0.w = -NAN;
          local_6e0.h = -NAN;
          QTextTableData::cellRect
                    ((QTextTableData *)CONCAT44(iVar19,in_stack_fffffffffffff718),
                     (QTextTableCell *)CONCAT44(in_stack_fffffffffffff714,in_stack_fffffffffffff710)
                    );
          dx = QPointF::x(&local_598);
          QRectF::translate(&local_6e0,dx,qVar16);
          local_700 = (PaintContext *)local_6e0.xp;
          local_6f8 = (QVarLengthArray<int,_256LL> *)local_6e0.yp;
          local_6f0 = (QTextDocumentPrivate *)local_6e0.w;
          local_6e8 = (QRectF *)local_6e0.h;
          cellRect_00.xp._4_4_ = in_stack_fffffffffffff7a4;
          cellRect_00.xp._0_4_ = in_stack_fffffffffffff7a0;
          cellRect_00.yp._0_4_ = in_stack_fffffffffffff7a8;
          cellRect_00.yp._4_4_ = in_stack_fffffffffffff7ac;
          cellRect_00.w = (qreal)in_stack_fffffffffffff7b0.i;
          cellRect_00.h = (qreal)in_stack_fffffffffffff7b8.i;
          in_stack_fffffffffffff6b8 = (PaintContext *)local_6e0.xp;
          in_stack_fffffffffffff6c0 = (QVarLengthArray<int,_256LL> *)local_6e0.yp;
          in_stack_fffffffffffff6c8 = (QTextDocumentPrivate *)local_6e0.w;
          in_stack_fffffffffffff6d0 = (QRectF *)local_6e0.h;
          bVar2 = cellClipTest(in_stack_fffffffffffff700,
                               (QTextTableData *)
                               CONCAT44(in_stack_fffffffffffff6fc,in_stack_fffffffffffff6f8),
                               (PaintContext *)in_stack_fffffffffffff6f0.i,
                               (QTextTableCell *)
                               CONCAT44(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8),
                               cellRect_00);
          if (!bVar2) {
            in_stack_fffffffffffff6c8 = (QTextDocumentPrivate *)local_448;
            in_stack_fffffffffffff6d0 = &local_608;
            in_stack_fffffffffffff6b8 =
                 (PaintContext *)CONCAT44((int)((ulong)in_stack_fffffffffffff6b8 >> 0x20),local_804)
            ;
            in_stack_fffffffffffff6c0 =
                 (QVarLengthArray<int,_256LL> *)
                 CONCAT44((int)((ulong)in_stack_fffffffffffff6c0 >> 0x20),local_808);
            drawTableCell(this_00,(QRectF *)CONCAT44(local_810,iVar3),(QPainter *)pQVar5,
                          (PaintContext *)CONCAT44(iVar23,in_stack_fffffffffffff828),
                          (QTextTable *)in_stack_fffffffffffff820,td_00,in_stack_fffffffffffffaf0,
                          in_stack_fffffffffffffaf8,in_stack_fffffffffffffb00,
                          in_stack_fffffffffffffb08);
          }
          QAbstractTextDocumentLayout::PaintContext::~PaintContext
                    ((PaintContext *)in_stack_fffffffffffff6c0);
          QTextTableCell::~QTextTableCell((QTextTableCell *)local_468);
        }
      }
    }
    local_704 = 0;
    iVar4 = local_810;
    bVar2 = QRectF::isValid((QRectF *)(in_RCX + 0x18));
    if (bVar2) {
      local_710.i = (QFixed *)&DAT_aaaaaaaaaaaaaaaa;
      QList<QFixed>::constBegin((QList<QFixed> *)in_stack_fffffffffffff6c0);
      QList<QFixed>::constEnd((QList<QFixed> *)in_stack_fffffffffffff6c0);
      QRectF::top((QRectF *)(in_RCX + 0x18));
      QPointF::y(&local_598);
      QFixed::fromReal((qreal)in_stack_fffffffffffff6b8);
      cVar13.i._4_4_ = in_stack_fffffffffffff6fc;
      cVar13.i._0_4_ = in_stack_fffffffffffff6f8;
      local_710 = std::lower_bound<QList<QFixed>::const_iterator,QFixed>
                            (cVar13,in_stack_fffffffffffff6f0,(QFixed *)in_stack_fffffffffffff6d0);
      cVar13 = QList<QFixed>::constEnd((QList<QFixed> *)in_stack_fffffffffffff6c0);
      bVar2 = QList<QFixed>::const_iterator::operator!=(&local_710,cVar13);
      if (bVar2) {
        cVar13 = QList<QFixed>::constBegin((QList<QFixed> *)in_stack_fffffffffffff6c0);
        bVar2 = QList<QFixed>::const_iterator::operator!=(&local_710,cVar13);
        if (bVar2) {
          QList<QFixed>::const_iterator::operator--(&local_710);
          cVar13 = QList<QFixed>::constBegin((QList<QFixed> *)in_stack_fffffffffffff6c0);
          qVar7 = QList<QFixed>::const_iterator::operator-(&local_710,cVar13);
          local_704 = (int)qVar7;
        }
      }
      in_stack_fffffffffffff7c0 =
           QList<QFixed>::constBegin((QList<QFixed> *)in_stack_fffffffffffff6c0);
      in_stack_fffffffffffff7b8 =
           QList<QFixed>::constEnd((QList<QFixed> *)in_stack_fffffffffffff6c0);
      in_stack_fffffffffffff700 = (QTextTable *)QRectF::bottom((QRectF *)(in_RCX + 0x18));
      QPointF::y(&local_598);
      in_stack_fffffffffffff8dc = QFixed::fromReal((qreal)in_stack_fffffffffffff6b8);
      __first.i._4_4_ = in_stack_fffffffffffff6fc;
      __first.i._0_4_ = in_stack_fffffffffffff6f8;
      local_710 = std::upper_bound<QList<QFixed>::const_iterator,QFixed>
                            (__first,in_stack_fffffffffffff6f0,(QFixed *)in_stack_fffffffffffff6d0);
      in_stack_fffffffffffff7b0 =
           QList<QFixed>::constEnd((QList<QFixed> *)in_stack_fffffffffffff6c0);
      bVar2 = QList<QFixed>::const_iterator::operator!=(&local_710,in_stack_fffffffffffff7b0);
      if (bVar2) {
        QList<QFixed>::const_iterator::operator++(&local_710);
        cVar13 = QList<QFixed>::constBegin((QList<QFixed> *)in_stack_fffffffffffff6c0);
        in_stack_fffffffffffff7a8 = SUB84(cVar13.i,0);
        in_stack_fffffffffffff7ac = (int)((ulong)cVar13.i >> 0x20);
        qVar7 = QList<QFixed>::const_iterator::operator-(&local_710,cVar13);
        local_810 = (int)qVar7;
      }
    }
    for (iVar22 = 0; iVar17 = local_704, iVar22 < iVar3; iVar22 = iVar22 + 1) {
      local_4c8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_4c8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QTextTable::cellAt((QTextTable *)in_stack_fffffffffffff6d8,
                         (int)((ulong)in_stack_fffffffffffff6d0 >> 0x20),
                         (int)in_stack_fffffffffffff6d0);
      local_728 = QTextTableCell::row((QTextTableCell *)in_stack_fffffffffffff6c8);
      piVar11 = qMin<int>(&local_704,&local_728);
      local_704 = *piVar11;
      QTextTableCell::~QTextTableCell((QTextTableCell *)local_4c8);
    }
    for (; iVar17 < local_810; iVar17 = iVar17 + 1) {
      for (local_864 = 0; local_864 < iVar3; local_864 = local_864 + 1) {
        local_4d8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_4d8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
        QTextTable::cellAt((QTextTable *)in_stack_fffffffffffff6d8,
                           (int)((ulong)in_stack_fffffffffffff6d0 >> 0x20),
                           (int)in_stack_fffffffffffff6d0);
        memcpy(local_528,&DAT_00bd2070,0x50);
        QAbstractTextDocumentLayout::PaintContext::PaintContext
                  ((PaintContext *)in_stack_fffffffffffff6c0,in_stack_fffffffffffff6b8);
        iVar18 = local_864;
        iVar21 = iVar17;
        QVLABase<int>::data(local_428);
        adjustContextSelectionsForCell
                  ((PaintContext *)in_stack_fffffffffffff6f0.i,
                   (QTextTableCell *)CONCAT44(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8),
                   (int)((ulong)in_stack_fffffffffffff6e0 >> 0x20),(int)in_stack_fffffffffffff6e0,
                   (int *)in_stack_fffffffffffff6d8);
        pPVar24 = (PaintContext *)0xffffffffffffffff;
        pQVar25 = (QVarLengthArray<int,_256LL> *)0xffffffffffffffff;
        in_stack_fffffffffffff6c8 = (QTextDocumentPrivate *)0xffffffffffffffff;
        QTextTableData::cellRect
                  ((QTextTableData *)CONCAT44(iVar19,in_stack_fffffffffffff718),
                   (QTextTableCell *)CONCAT44(in_stack_fffffffffffff714,in_stack_fffffffffffff710));
        QRectF::translate((QRectF *)in_stack_fffffffffffff6c0,(QPointF *)in_stack_fffffffffffff6b8);
        in_stack_fffffffffffff6c0 = pQVar25;
        in_stack_fffffffffffff6b8 = pPVar24;
        in_stack_fffffffffffff6d0 = (QRectF *)0xffffffffffffffff;
        cellRect_01.xp._4_4_ = iVar22;
        cellRect_01.xp._0_4_ = iVar21;
        cellRect_01.yp._0_4_ = in_stack_fffffffffffff7a8;
        cellRect_01.yp._4_4_ = in_stack_fffffffffffff7ac;
        cellRect_01.w = (qreal)in_stack_fffffffffffff7b0.i;
        cellRect_01.h = (qreal)in_stack_fffffffffffff7b8.i;
        bVar2 = cellClipTest(in_stack_fffffffffffff700,(QTextTableData *)CONCAT44(iVar18,iVar17),
                             (PaintContext *)in_stack_fffffffffffff6f0.i,
                             (QTextTableCell *)
                             CONCAT44(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8),
                             cellRect_01);
        iVar17 = iVar21;
        if (!bVar2) {
          in_stack_fffffffffffff6c8 = (QTextDocumentPrivate *)local_448;
          in_stack_fffffffffffff6d0 = &local_608;
          in_stack_fffffffffffff6b8 =
               (PaintContext *)CONCAT44((int)((ulong)in_stack_fffffffffffff6b8 >> 0x20),iVar21);
          in_stack_fffffffffffff6c0 =
               (QVarLengthArray<int,_256LL> *)
               CONCAT44((int)((ulong)in_stack_fffffffffffff6c0 >> 0x20),local_864);
          drawTableCell(this_00,(QRectF *)CONCAT44(iVar4,iVar3),(QPainter *)pQVar5,
                        (PaintContext *)CONCAT44(iVar23,in_stack_fffffffffffff828),
                        (QTextTable *)in_stack_fffffffffffff820,td_00,in_stack_fffffffffffffaf0,
                        in_stack_fffffffffffffaf8,in_stack_fffffffffffffb00,
                        in_stack_fffffffffffffb08);
          iVar17 = iVar21;
        }
        QAbstractTextDocumentLayout::PaintContext::~PaintContext
                  ((PaintContext *)in_stack_fffffffffffff6c0);
        QTextTableCell::~QTextTableCell((QTextTableCell *)local_4d8);
      }
    }
    QVarLengthArray<int,_256LL>::~QVarLengthArray(in_stack_fffffffffffff6c0);
  }
  bVar2 = QTextBlock::isValid((QTextBlock *)in_stack_fffffffffffff6c0);
  if (bVar2) {
    QPainter::pen((QPainter *)in_stack_fffffffffffff6c0);
    QPen::QPen((QPen *)in_stack_fffffffffffff6c0,(QPen *)in_stack_fffffffffffff6b8);
    QPalette::color((QPalette *)in_stack_fffffffffffff6c0,
                    (ColorRole)((ulong)in_stack_fffffffffffff6b8 >> 0x20));
    QPainter::setPen((QPainter *)in_stack_fffffffffffff6c8,(QColor *)in_stack_fffffffffffff6c0);
    QTextBlock::position((QTextBlock *)in_stack_fffffffffffff6b8);
    QTextBlock::layout((QTextBlock *)in_stack_fffffffffffff6c8);
    QTextLayout::drawCursor
              ((QTextLayout *)in_stack_fffffffffffff7c0.i,(QPainter *)in_stack_fffffffffffff7b8.i,
               (QPointF *)in_stack_fffffffffffff7b0.i,in_stack_fffffffffffff8dc.val,
               in_stack_fffffffffffff7ac);
    QPainter::setPen((QPainter *)in_stack_fffffffffffff6c8,(QPen *)in_stack_fffffffffffff6c0);
    QPen::~QPen((QPen *)0x7fbabc);
  }
LAB_007fbabe:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_10) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTextDocumentLayoutPrivate::drawFrame(const QPointF &offset, QPainter *painter,
                                           const QAbstractTextDocumentLayout::PaintContext &context,
                                           QTextFrame *frame) const
{
    QTextFrameData *fd = data(frame);
    // #######
    if (fd->layoutDirty)
        return;
    Q_ASSERT(!fd->sizeDirty);
    Q_ASSERT(!fd->layoutDirty);

    // floor the offset to avoid painting artefacts when drawing adjacent borders
    // we later also round table cell heights and widths
    const QPointF off = QPointF(QPointF(offset + fd->position.toPointF()).toPoint());

    if (context.clip.isValid()
        && (off.y() > context.clip.bottom() || off.y() + fd->size.height.toReal() < context.clip.top()
            || off.x() > context.clip.right() || off.x() + fd->size.width.toReal() < context.clip.left()))
        return;

     qCDebug(lcDraw) << "drawFrame" << frame->firstPosition() << "--" << frame->lastPosition() << "at" << offset;

    // if the cursor is /on/ a table border we may need to repaint it
    // afterwards, as we usually draw the decoration first
    QTextBlock cursorBlockNeedingRepaint;
    QPointF offsetOfRepaintedCursorBlock = off;

    QTextTable *table = qobject_cast<QTextTable *>(frame);
    const QRectF frameRect(off, fd->size.toSizeF());

    if (table) {
        const int rows = table->rows();
        const int columns = table->columns();
        QTextTableData *td = static_cast<QTextTableData *>(data(table));

        QVarLengthArray<int> selectedTableCells(context.selections.size() * 4);
        for (int i = 0; i < context.selections.size(); ++i) {
            const QAbstractTextDocumentLayout::Selection &s = context.selections.at(i);
            int row_start = -1, col_start = -1, num_rows = -1, num_cols = -1;

            if (s.cursor.currentTable() == table)
                s.cursor.selectedTableCells(&row_start, &num_rows, &col_start, &num_cols);

            selectedTableCells[i * 4] = row_start;
            selectedTableCells[i * 4 + 1] = col_start;
            selectedTableCells[i * 4 + 2] = num_rows;
            selectedTableCells[i * 4 + 3] = num_cols;
        }

        QFixed pageHeight = QFixed::fromReal(document->pageSize().height());
        if (pageHeight <= 0)
            pageHeight = QFIXED_MAX;

        QFixed absYPos = td->position.y;
        QTextFrame *parentFrame = table->parentFrame();
        while (parentFrame) {
            absYPos += data(parentFrame)->position.y;
            parentFrame = parentFrame->parentFrame();
        }
        const int tableStartPage = (absYPos / pageHeight).truncate();
        const int tableEndPage = ((absYPos + td->size.height) / pageHeight).truncate();

        // for borderCollapse draw frame decoration by drawing the outermost
        // cell edges with width = td->border
        if (!td->borderCollapse)
            drawFrameDecoration(painter, frame, fd, context.clip, frameRect);

        // draw the repeated table headers for table continuation after page breaks
        const int headerRowCount = qMin(table->format().headerRowCount(), rows - 1);
        int page = tableStartPage + 1;
        while (page <= tableEndPage) {
            const QFixed pageTop = page * pageHeight + td->effectiveTopMargin + td->cellSpacing + td->border;
            const qreal headerOffset = (pageTop - td->rowPositions.at(0)).toReal();
            for (int r = 0; r < headerRowCount; ++r) {
                for (int c = 0; c < columns; ++c) {
                    QTextTableCell cell = table->cellAt(r, c);
                    QAbstractTextDocumentLayout::PaintContext cell_context = context;
                    adjustContextSelectionsForCell(cell_context, cell, r, c, selectedTableCells.data());
                    QRectF cellRect = td->cellRect(cell);

                    cellRect.translate(off.x(), headerOffset);
                    if (cellClipTest(table, td, cell_context, cell, cellRect))
                        continue;

                    drawTableCell(cellRect, painter, cell_context, table, td, r, c, &cursorBlockNeedingRepaint,
                                  &offsetOfRepaintedCursorBlock);
                }
            }
            ++page;
        }

        int firstRow = 0;
        int lastRow = rows;

        if (context.clip.isValid()) {
            auto rowIt = std::lower_bound(td->rowPositions.constBegin(), td->rowPositions.constEnd(), QFixed::fromReal(context.clip.top() - off.y()));
            if (rowIt != td->rowPositions.constEnd() && rowIt != td->rowPositions.constBegin()) {
                --rowIt;
                firstRow = rowIt - td->rowPositions.constBegin();
            }

            rowIt = std::upper_bound(td->rowPositions.constBegin(), td->rowPositions.constEnd(), QFixed::fromReal(context.clip.bottom() - off.y()));
            if (rowIt != td->rowPositions.constEnd()) {
                ++rowIt;
                lastRow = rowIt - td->rowPositions.constBegin();
            }
        }

        for (int c = 0; c < columns; ++c) {
            QTextTableCell cell = table->cellAt(firstRow, c);
            firstRow = qMin(firstRow, cell.row());
        }

        for (int r = firstRow; r < lastRow; ++r) {
            for (int c = 0; c < columns; ++c) {
                QTextTableCell cell = table->cellAt(r, c);
                QAbstractTextDocumentLayout::PaintContext cell_context = context;
                adjustContextSelectionsForCell(cell_context, cell, r, c, selectedTableCells.data());
                QRectF cellRect = td->cellRect(cell);

                cellRect.translate(off);
                if (cellClipTest(table, td, cell_context, cell, cellRect))
                    continue;

                drawTableCell(cellRect, painter, cell_context, table, td, r, c, &cursorBlockNeedingRepaint,
                              &offsetOfRepaintedCursorBlock);
            }
        }

    } else {
        drawFrameDecoration(painter, frame, fd, context.clip, frameRect);

        QTextFrame::Iterator it = frame->begin();

        if (frame == docPrivate->rootFrame())
            it = frameIteratorForYPosition(QFixed::fromReal(context.clip.top()));

        QList<QTextFrame *> floats;
        const int numFloats = fd->floats.size();
        floats.reserve(numFloats);
        for (int i = 0; i < numFloats; ++i)
            floats.append(fd->floats.at(i));

        drawFlow(off, painter, context, it, floats, &cursorBlockNeedingRepaint);
    }

    if (cursorBlockNeedingRepaint.isValid()) {
        const QPen oldPen = painter->pen();
        painter->setPen(context.palette.color(QPalette::Text));
        const int cursorPos = context.cursorPosition - cursorBlockNeedingRepaint.position();
        cursorBlockNeedingRepaint.layout()->drawCursor(painter, offsetOfRepaintedCursorBlock,
                                                       cursorPos, cursorWidth);
        painter->setPen(oldPen);
    }

    return;
}